

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O2

int properties_set_creation_time(PROPERTIES_HANDLE properties,timestamp creation_time_value)

{
  int iVar1;
  AMQP_VALUE item_value;
  int iVar2;
  PROPERTIES_INSTANCE *properties_instance;
  
  if (properties == (PROPERTIES_HANDLE)0x0) {
    iVar2 = 0x41bd;
  }
  else {
    item_value = amqpvalue_create_timestamp(creation_time_value);
    if (item_value == (AMQP_VALUE)0x0) {
      iVar2 = 0x41c5;
    }
    else {
      iVar1 = amqpvalue_set_composite_item(properties->composite_value,9,item_value);
      iVar2 = 0x41cb;
      if (iVar1 == 0) {
        iVar2 = 0;
      }
      amqpvalue_destroy(item_value);
    }
  }
  return iVar2;
}

Assistant:

int properties_set_creation_time(PROPERTIES_HANDLE properties, timestamp creation_time_value)
{
    int result;

    if (properties == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        PROPERTIES_INSTANCE* properties_instance = (PROPERTIES_INSTANCE*)properties;
        AMQP_VALUE creation_time_amqp_value = amqpvalue_create_timestamp(creation_time_value);
        if (creation_time_amqp_value == NULL)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (amqpvalue_set_composite_item(properties_instance->composite_value, 9, creation_time_amqp_value) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }

            amqpvalue_destroy(creation_time_amqp_value);
        }
    }

    return result;
}